

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skills.c
# Opt level: O3

void do_gain(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *format;
  CHAR_DATA *ch_00;
  char arg [4608];
  char local_1228 [4616];
  
  bVar1 = is_npc(ch);
  if (bVar1) {
    return;
  }
  ch_00 = ch->in_room->people;
  do {
    if (ch_00 == (CHAR_DATA *)0x0) {
LAB_002bde05:
      send_to_char("You can\'t do that here.\n\r",ch);
      return;
    }
    bVar1 = is_npc(ch_00);
    if ((bVar1) && ((ch_00->act[0] & 0x8000200) != 0)) {
      bVar1 = can_see(ch,ch_00);
      if (bVar1) {
        one_argument(argument,local_1228);
        if (local_1228[0] == '\0') {
          do_say(ch_00,"Use gain convert to convert 10 practices into 1 train.");
          do_say(ch_00,"Or use gain revert to revert 1 train into 10 practices.");
          return;
        }
        bVar1 = str_prefix(local_1228,"convert");
        if (bVar1) {
          bVar1 = str_prefix(local_1228,"revert");
          if (bVar1) {
            format = "$N tells you \'I do not understand...\'";
          }
          else {
            if (0 < ch->train) {
              act("$N helps you apply your training to skills practices.",ch,(void *)0x0,ch_00,3);
              ch->practice = ch->practice + 10;
              ch->train = ch->train + -1;
              return;
            }
            format = 
            "$N tells you \'You do not have the training to apply to your skill practices yet.\'";
          }
        }
        else {
          if (9 < ch->practice) {
            act("$N helps you apply your practice to training",ch,(void *)0x0,ch_00,3);
            ch->practice = ch->practice + -10;
            ch->train = ch->train + 1;
            return;
          }
          format = "$N tells you \'You are not yet ready.\'";
        }
        act(format,ch,(void *)0x0,ch_00,3);
        return;
      }
      goto LAB_002bde05;
    }
    ch_00 = ch_00->next_in_room;
  } while( true );
}

Assistant:

void do_gain(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *trainer;

	if (is_npc(ch))
		return;

	/* find a trainer */
	for (trainer = ch->in_room->people; trainer != nullptr; trainer = trainer->next_in_room)
	{
		if (is_npc(trainer) && (IS_SET(trainer->act, ACT_GAIN) || IS_SET(trainer->act, ACT_TRAIN)))
			break;
	}

	if (trainer == nullptr || !can_see(ch, trainer))
	{
		send_to_char("You can't do that here.\n\r", ch);
		return;
	}

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		do_say(trainer, "Use gain convert to convert 10 practices into 1 train.");
		do_say(trainer, "Or use gain revert to revert 1 train into 10 practices.");
		return;
	}

	if (!str_prefix(arg, "convert"))
	{
		if (ch->practice < 10)
		{
			act("$N tells you 'You are not yet ready.'", ch, nullptr, trainer, TO_CHAR);
			return;
		}

		act("$N helps you apply your practice to training", ch, nullptr, trainer, TO_CHAR);
		ch->practice -= 10;
		ch->train += 1;
		return;
	}

	/* 'gain revert' converts one train into 10 pracs */
	if (!str_prefix(arg, "revert"))
	{
		if (ch->train < 1)
		{
			act("$N tells you 'You do not have the training to apply to your skill practices yet.'", ch, nullptr, trainer, TO_CHAR);
			return;
		}

		act("$N helps you apply your training to skills practices.", ch, nullptr, trainer, TO_CHAR);
		ch->practice += 10;
		ch->train -= 1;
		return;
	}

	act("$N tells you 'I do not understand...'", ch, nullptr, trainer, TO_CHAR);
}